

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(run_for_at_least_argument_t<system_clock,_benchmark_function_&>)>
 nonius::detail::
 run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::benchmark_function&>
           (parameters *params,Duration<std::chrono::_V2::system_clock> how_long,int seed,
           benchmark_function *fun)

{
  bool bVar1;
  undefined8 *puVar2;
  chronometer_model<std::chrono::_V2::system_clock> meter;
  
  if (seed < 0x40000000) {
    do {
      (*((fun->f)._M_t.
         super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
         ._M_t.
         super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
         .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl)
        ->_vptr_concept[1])();
      if (how_long.__r < 1) {
        return (TimingOf<std::chrono::_V2::system_clock,_nonius::detail::benchmark_function_&(run_for_at_least_argument_t<system_clock,_benchmark_function_&>)>
                )(ZEXT416((uint)seed) << 0x60);
      }
      bVar1 = seed < 0x20000000;
      seed = seed * 2;
    } while (bVar1);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_0020c2b0;
  __cxa_throw(puVar2,&optimized_away_error::typeinfo,std::exception::~exception);
}

Assistant:

TimingOf<Clock, Fun(run_for_at_least_argument_t<Clock, Fun>)> run_for_at_least(const parameters& params, Duration<Clock> how_long, int seed, Fun&& fun) {
            auto iters = seed;
            while(iters < (1 << 30)) {
                auto&& timing = measure_one<Clock>(fun, iters, params, detail::is_callable<Fun(chronometer)>());

                if(timing.elapsed >= how_long) {
                    return { timing.elapsed, std::move(timing.result), iters };
                }
                iters *= 2;
            }
            throw optimized_away_error{};
        }